

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::Texture2DLodControlCase::init
          (Texture2DLodControlCase *this,EVP_PKEY_CTX *ctx)

{
  pointer pPVar1;
  int extraout_EAX;
  uint uVar2;
  int extraout_EAX_00;
  int iVar3;
  Texture2D *this_00;
  ulong uVar4;
  int levelNdx;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  deUint32 step;
  RGBA local_4c;
  ulong local_48;
  Vec4 local_40;
  
  uVar8 = this->m_texWidth;
  uVar2 = this->m_texHeight;
  uVar5 = uVar2;
  if ((int)uVar2 < (int)uVar8) {
    uVar5 = uVar8;
  }
  if (uVar5 == 0) {
    uVar6 = 0x20;
  }
  else {
    uVar6 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = uVar6 ^ 0x1f;
  }
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,0x8058,uVar8,uVar2);
  this->m_texture = this_00;
  iVar3 = extraout_EAX;
  if (uVar5 != 0) {
    uVar6 = 0x1f - uVar6;
    uVar7 = 0;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = uVar7;
    }
    local_48 = uVar4 * 0x28 + 0x28;
    uVar8 = 0;
    levelNdx = 0;
    do {
      uVar2 = 0xff;
      if (uVar8 < 0xff) {
        uVar2 = uVar8;
      }
      uVar2 = uVar2 * 0x10100 ^ 0xff00ffff;
      if ((int)uVar8 < 0) {
        uVar2 = 0xff00ffff;
      }
      tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,levelNdx);
      pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_4c.m_value = uVar2;
      tcu::RGBA::toVec(&local_4c);
      tcu::clear((PixelBufferAccess *)
                 ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + uVar7 + -8),&local_40
                );
      levelNdx = levelNdx + 1;
      uVar8 = uVar8 + (int)(short)(0xff / (int)(short)uVar6);
      uVar7 = uVar7 + 0x28;
      iVar3 = extraout_EAX_00;
    } while (local_48 != uVar7);
  }
  return iVar3;
}

Assistant:

void Texture2DLodControlCase::init (void)
{
	const deUint32	format		= GL_RGBA8;
	int				numLevels	= deLog2Floor32(de::max(m_texWidth, m_texHeight))+1;

	m_texture = new glu::Texture2D(m_context.getRenderContext(), format, m_texWidth, m_texHeight);

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec());
	}
}